

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

AstNode * new_field_selector(ParserState *parser,StringObject *ts)

{
  _Bool *p_Var1;
  uint uVar2;
  C_MemoryAllocator *pCVar3;
  AstNode *pAVar4;
  AstNode *pAVar5;
  
  uVar2 = parser->ls->lastline;
  pCVar3 = parser->compiler_state->allocator;
  pAVar4 = (AstNode *)(*pCVar3->calloc)(pCVar3->arena,1,0x50);
  pAVar4->type = EXPR_FIELD_SELECTOR;
  pAVar4->line_number = uVar2;
  p_Var1 = &(pAVar4->field_2).embedded_C_stmt.is_decl;
  *p_Var1 = (_Bool)(*p_Var1 & 0xfe);
  (pAVar4->field_2).common_expr.type.type_code = RAVI_TANY;
  uVar2 = parser->ls->lastline;
  pCVar3 = parser->compiler_state->allocator;
  pAVar5 = (AstNode *)(*pCVar3->calloc)(pCVar3->arena,1,0x50);
  pAVar5->type = EXPR_LITERAL;
  pAVar5->line_number = uVar2;
  p_Var1 = &(pAVar5->field_2).embedded_C_stmt.is_decl;
  *p_Var1 = (_Bool)(*p_Var1 & 0xfe);
  (pAVar5->field_2).common_expr.type.type_code = RAVI_TSTRING;
  (pAVar5->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar5->field_2).function_call_expr.method_name = ts;
  (pAVar4->field_2).function_stmt.function_expr = pAVar5;
  (pAVar4->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar4->field_2).goto_stmt.name = (StringObject *)0x0;
  return pAVar4;
}

Assistant:

static AstNode *new_field_selector(ParserState *parser, const StringObject *ts)
{
	AstNode *index = allocate_expr_ast_node(parser, EXPR_FIELD_SELECTOR);
	index->index_expr.expr = new_string_literal(parser, ts);
	set_type(&index->index_expr.type, RAVI_TANY);
	return index;
}